

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

BuilderFor<DynamicCapability> *
capnp::DynamicValue::Builder::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (BuilderFor<DynamicCapability> *__return_storage_ptr__,Builder *builder)

{
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Fault f;
  
  _kjCondition.result = builder->type == CAPABILITY;
  _kjCondition.right = CAPABILITY;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &builder->type;
  if (_kjCondition.result) {
    (*(code *)(((builder->field_1).structValue.builder.segment)->super_SegmentReader).arena[4].
              _vptr_Arena)(__return_storage_ptr__);
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)(builder->field_1).textValue.content.size_;
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[21]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x739,FAILED,"builder.type == CAPABILITY","_kjCondition,\"Value type mismatch.\"",
               &_kjCondition,(char (*) [21])"Value type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x38ac08;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

BuilderFor<DynamicCapability> DynamicValue::Builder::AsImpl<DynamicCapability>::apply(
    Builder& builder) {
  KJ_REQUIRE(builder.type == CAPABILITY, "Value type mismatch.") {
    return DynamicCapability::Client();
  }
  return builder.capabilityValue;
}